

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void freehash(hashelement_t **hash)

{
  hashelement_t *phVar1;
  hashelement_t *__ptr;
  int32 i;
  long lVar2;
  
  lVar2 = 0;
  do {
    __ptr = hash[lVar2];
    while (__ptr != (hashelement_t *)0x0) {
      phVar1 = __ptr->next;
      free(__ptr->basephone);
      if (__ptr->leftcontext != (char *)0x0) {
        free(__ptr->leftcontext);
      }
      if (__ptr->rightcontext != (char *)0x0) {
        free(__ptr->rightcontext);
      }
      if (__ptr->wordposition != (char *)0x0) {
        free(__ptr->wordposition);
      }
      free(__ptr);
      __ptr = phVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x5dc1);
  free(hash);
  return;
}

Assistant:

void freehash(hashelement_t **hash)
{
    int32 i;
    hashelement_t *e1, *e2;

    for (i=0; i < HASHSIZE; i++){
        e1 = hash[i];
        while (e1 != NULL){
	   e2 = e1->next;
	   free(e1->basephone);
	   if (e1->leftcontext != NULL) free(e1->leftcontext);
	   if (e1->rightcontext != NULL) free(e1->rightcontext);
	   if (e1->wordposition != NULL) free(e1->wordposition);
           free(e1);
           e1 = e2;
        }
    }
    free(hash);
}